

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

uint8_t spvtools::utils::get_nibble_from_character(int character)

{
  char *pcVar1;
  char *p;
  char *upper;
  char *lower;
  char *dec;
  int character_local;
  
  pcVar1 = strchr("0123456789",character);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strchr("abcdef",character);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = strchr("ABCDEF",character);
      if (pcVar1 == (char *)0x0) {
        __assert_fail("false && \"This was called with a non-hex character\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                      ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
      }
      dec._7_1_ = (char)pcVar1 + 0x8d;
    }
    else {
      dec._7_1_ = (char)pcVar1 + 0x94;
    }
  }
  else {
    dec._7_1_ = (char)pcVar1 + 0xaf;
  }
  return dec._7_1_;
}

Assistant:

inline uint8_t get_nibble_from_character(int character) {
  const char* dec = "0123456789";
  const char* lower = "abcdef";
  const char* upper = "ABCDEF";
  const char* p = nullptr;
  if ((p = strchr(dec, character))) {
    return static_cast<uint8_t>(p - dec);
  } else if ((p = strchr(lower, character))) {
    return static_cast<uint8_t>(p - lower + 0xa);
  } else if ((p = strchr(upper, character))) {
    return static_cast<uint8_t>(p - upper + 0xa);
  }

  assert(false && "This was called with a non-hex character");
  return 0;
}